

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedFieldRef<google::protobuf::Message,_void>::RepeatedFieldRef
          (RepeatedFieldRef<google::protobuf::Message,_void> *this,
          MakeDependent<google::protobuf::Message,_Message> *message,FieldDescriptor *field)

{
  int iVar1;
  Reflection *this_00;
  Descriptor *pDVar2;
  void *pvVar3;
  RepeatedFieldAccessor *pRVar4;
  MessageFactory *pMVar5;
  undefined4 extraout_var;
  Reflection *reflection;
  FieldDescriptor *field_local;
  MakeDependent<google::protobuf::Message,_Message> *message_local;
  RepeatedFieldRef<google::protobuf::Message,_void> *this_local;
  
  this_00 = Message::GetReflection(message);
  pDVar2 = internal::RefTypeTraits<google::protobuf::Message,_void>::GetMessageFieldDescriptor();
  pvVar3 = Reflection::RepeatedFieldData(this_00,message,field,CPPTYPE_MESSAGE,pDVar2);
  this->data_ = pvVar3;
  pRVar4 = Reflection::RepeatedFieldAccessor(this_00,field);
  this->accessor_ = pRVar4;
  pMVar5 = Reflection::GetMessageFactory(this_00);
  pDVar2 = FieldDescriptor::message_type(field);
  iVar1 = (*pMVar5->_vptr_MessageFactory[2])(pMVar5,pDVar2);
  this->default_instance_ = (Message *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

RepeatedFieldRef(const MakeDependent<T, Message>& message,
                   const FieldDescriptor* field) {
    const auto* reflection = message.GetReflection();
    data_ = reflection->RepeatedFieldData(
        message, field, internal::RefTypeTraits<T>::cpp_type,
        internal::RefTypeTraits<T>::GetMessageFieldDescriptor());
    accessor_ = reflection->RepeatedFieldAccessor(field);
    default_instance_ = static_cast<const T*>(
        reflection->GetMessageFactory()->GetPrototype(field->message_type()));
  }